

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_initDStream(ZSTD_DStream *zds)

{
  zds->streamStage = zdss_init;
  zds->noForwardProgress = 0;
  ZSTD_freeDDict(zds->ddictLocal);
  zds->dictUses = ZSTD_dont_use;
  zds->ddictLocal = (ZSTD_DDict *)0x0;
  zds->ddict = (ZSTD_DDict *)0x0;
  return (ulong)(zds->format == ZSTD_f_zstd1) * 4 + 1;
}

Assistant:

size_t ZSTD_initDStream(ZSTD_DStream* zds)
{
    DEBUGLOG(4, "ZSTD_initDStream");
    return ZSTD_initDStream_usingDDict(zds, NULL);
}